

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O1

void __thiscall
dxil_spv::SPIRVModule::Impl::add_instruction
          (Impl *this,Block *bb,
          unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst)

{
  uint uVar1;
  Vector<std::unique_ptr<Instruction>_> *this_00;
  Vector<Id> *this_01;
  Op op;
  Id id;
  uint uVar2;
  Id IVar3;
  iterator iVar4;
  Instruction *instruction;
  Instruction *pIVar5;
  Instruction *instruction_00;
  Instruction *raw_instruction_2;
  uint uVar6;
  Instruction *raw_instruction;
  Instruction *raw_instruction_1;
  uint local_68;
  uint local_64;
  Id local_60;
  uint local_5c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_58;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  ulong local_38;
  
  pIVar5 = (inst->_M_t).
           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
           super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  op = pIVar5->opCode;
  id = pIVar5->resultId;
  if ((((id != 0) && ((this->instruction_instrumentation).info.enabled == true)) &&
      ((this->instruction_instrumentation).info.type == FlushNaNToZero)) && (op != OpPhi)) {
    uVar2 = pIVar5->typeId;
    local_38 = (ulong)uVar2;
    if ((this->builder).module.idToInstruction.
        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
        _M_impl.super__Vector_impl_data._M_start[local_38]->opCode == OpTypeFloat) {
      IVar3 = (this->builder).uniqueId;
      uVar1 = IVar3 + 1;
      uVar6 = IVar3 + 2;
      (this->builder).uniqueId = uVar6;
      pIVar5->resultId = uVar1;
      local_5c = spv::Builder::makeNullConstant(&this->builder,uVar2);
      local_60 = spv::Builder::makeBoolType(&this->builder);
      pIVar5 = (Instruction *)allocate_in_thread(0x38);
      pIVar5->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
      pIVar5->resultId = uVar6;
      pIVar5->typeId = local_60;
      pIVar5->opCode = OpIsNan;
      (pIVar5->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar5->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pIVar5->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pIVar5->block = (Block *)0x0;
      iVar4._M_current =
           (pIVar5->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_68 = uVar1;
      local_64 = uVar1;
      if (iVar4._M_current ==
          (pIVar5->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar5->operands,iVar4,&local_68);
      }
      else {
        *iVar4._M_current = uVar1;
        (pIVar5->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      instruction_00 = (Instruction *)allocate_in_thread(0x38);
      instruction_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
      instruction_00->resultId = id;
      instruction_00->typeId = (Id)local_38;
      instruction_00->opCode = OpSelect;
      this_01 = &instruction_00->operands;
      (instruction_00->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (instruction_00->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (instruction_00->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      instruction_00->block = (Block *)0x0;
      iVar4._M_current =
           (instruction_00->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (instruction_00->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_68 = uVar6;
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_01,
                   iVar4,&local_68);
      }
      else {
        *iVar4._M_current = uVar6;
        (instruction_00->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      uVar2 = local_64;
      local_68 = local_5c;
      iVar4._M_current =
           (instruction_00->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (instruction_00->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_01,
                   iVar4,&local_68);
      }
      else {
        *iVar4._M_current = local_5c;
        (instruction_00->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      local_68 = uVar2;
      iVar4._M_current =
           (instruction_00->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (instruction_00->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_01,
                   iVar4,&local_68);
      }
      else {
        *iVar4._M_current = uVar2;
        (instruction_00->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      instruction = (inst->_M_t).
                    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
      (inst->_M_t).super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
      _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
      this_00 = &bb->instructions;
      local_40._M_head_impl = instruction;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)this_00,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
      instruction->block = bb;
      if (instruction->resultId != 0) {
        spv::Module::mapInstruction(bb->parent->parent,instruction);
      }
      if (local_40._M_head_impl != (Instruction *)0x0) {
        (*(local_40._M_head_impl)->_vptr_Instruction[1])();
      }
      local_40._M_head_impl = (Instruction *)0x0;
      local_48._M_head_impl = pIVar5;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)this_00,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_48);
      pIVar5->block = bb;
      if (pIVar5->resultId != 0) {
        spv::Module::mapInstruction(bb->parent->parent,pIVar5);
      }
      if (local_48._M_head_impl != (Instruction *)0x0) {
        (*(local_48._M_head_impl)->_vptr_Instruction[1])();
      }
      local_48._M_head_impl = (Instruction *)0x0;
      local_50._M_head_impl = instruction_00;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)this_00,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_50);
      instruction_00->block = bb;
      if (instruction_00->resultId != 0) {
        spv::Module::mapInstruction(bb->parent->parent,instruction_00);
      }
      if (local_50._M_head_impl == (Instruction *)0x0) {
        return;
      }
      (*(local_50._M_head_impl)->_vptr_Instruction[1])();
      return;
    }
  }
  pIVar5 = (inst->_M_t).
           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
           super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  (inst->_M_t).super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
  local_58._M_head_impl = pIVar5;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&bb->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_58);
  pIVar5->block = bb;
  if (pIVar5->resultId != 0) {
    spv::Module::mapInstruction(bb->parent->parent,pIVar5);
  }
  if (local_58._M_head_impl != (Instruction *)0x0) {
    (*(local_58._M_head_impl)->_vptr_Instruction[1])();
  }
  local_58._M_head_impl = (Instruction *)0x0;
  if ((((this->instruction_instrumentation).info.enabled == true) && (op != OpPhi)) &&
     ((this->instruction_instrumentation).info.type == FullNanInf)) {
    add_instrumented_instruction(this,op,bb,id);
  }
  return;
}

Assistant:

void SPIRVModule::Impl::add_instruction(spv::Block *bb, std::unique_ptr<spv::Instruction> inst)
{
	spv::Op op = inst->getOpCode();
	spv::Id id = inst->getResultId();
	spv::Id type_id = inst->getTypeId();

	if (id != 0 && instruction_instrumentation.info.enabled &&
	    instruction_instrumentation.info.type == InstructionInstrumentationType::FlushNaNToZero &&
	    builder.getTypeClass(type_id) == spv::OpTypeFloat && op != spv::OpPhi)
	{
		// A bit special since we're rewriting the IDs.
		spv::Id new_id = builder.getUniqueId();
		spv::Id nan_id = builder.getUniqueId();
		inst->setResultId(new_id);

		spv::Id null_const = builder.makeNullConstant(type_id);
		auto is_nan = std::make_unique<spv::Instruction>(nan_id, builder.makeBoolType(), spv::OpIsNan);
		is_nan->addIdOperand(new_id);
		auto replaced = std::make_unique<spv::Instruction>(id, type_id, spv::OpSelect);
		replaced->addIdOperand(nan_id);
		replaced->addIdOperand(null_const);
		replaced->addIdOperand(new_id);

		bb->addInstruction(std::move(inst));
		bb->addInstruction(std::move(is_nan));
		bb->addInstruction(std::move(replaced));
	}
	else
	{
		bb->addInstruction(std::move(inst));

		// For Full instrumentation add everything, otherwise, we need specialized instrumentation.
		if (instruction_instrumentation.info.enabled &&
		    instruction_instrumentation.info.type == InstructionInstrumentationType::FullNanInf &&
		    op != spv::OpPhi)
		{
			add_instrumented_instruction(op, bb, id);
		}
	}
}